

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

int fy_tag_token_format_internal(fy_token *fyt,void *out,size_t *outszp)

{
  uint uVar1;
  uint8_t auVar2 [4];
  int iVar3;
  char *pcVar4;
  char *s_00;
  char *local_a8;
  uint8_t local_a0 [4];
  int _cl_2;
  int _l_2;
  int _cl_1;
  int _l_1;
  int _cl;
  int _l;
  char *e;
  char *s;
  char *t;
  uint8_t code [4];
  int rlen;
  int code_length;
  int len;
  size_t suffix_size;
  size_t handle_size;
  char *suffix;
  char *handle;
  size_t outsz;
  char *oe;
  char *o;
  size_t *outszp_local;
  void *out_local;
  fy_token *fyt_local;
  
  oe = (char *)0x0;
  outsz = 0;
  if ((fyt == (fy_token *)0x0) || (fyt->type != FYTT_TAG)) {
    fyt_local._4_4_ = 0;
  }
  else if ((out == (void *)0x0) || (*outszp != 0)) {
    if (out != (void *)0x0) {
      handle = (char *)*outszp;
      outsz = (long)out + (long)handle;
      oe = (char *)out;
    }
    if ((fyt->field_9).tag.fyt_td == (fy_token *)0x0) {
      fyt_local._4_4_ = -1;
    }
    else {
      o = (char *)outszp;
      outszp_local = (size_t *)out;
      out_local = fyt;
      suffix = fy_tag_directive_token_prefix((fyt->field_9).tag.fyt_td,&suffix_size);
      if (suffix == (char *)0x0) {
        fyt_local._4_4_ = -1;
      }
      else {
        pcVar4 = fy_atom_data((fy_atom *)((long)out_local + 0x38));
        handle_size = (size_t)(pcVar4 + (ulong)*(uint *)((long)out_local + 0x11c) +
                                        (ulong)*(uint *)((long)out_local + 0x118));
        uVar1 = *(uint *)((long)out_local + 0x120);
        _cl_1 = (int)suffix_size;
        if ((oe != (char *)0x0) && ((int)suffix_size != 0)) {
          if ((long)(outsz - (long)oe) < (long)(int)suffix_size) {
            _cl_1 = (int)outsz - (int)oe;
          }
          memcpy(oe,suffix,(long)_cl_1);
          oe = oe + _cl_1;
        }
        rlen = (int)suffix_size;
        e = (char *)handle_size;
        pcVar4 = (char *)(handle_size + uVar1);
        while (e < pcVar4) {
          s_00 = (char *)memchr(e,0x25,(long)pcVar4 - (long)e);
          local_a8 = pcVar4;
          if (s_00 != (char *)0x0) {
            local_a8 = s_00;
          }
          iVar3 = (int)local_a8 - (int)e;
          t._4_4_ = iVar3;
          if ((oe != (char *)0x0) && (iVar3 != 0)) {
            _cl_2 = iVar3;
            if ((long)(outsz - (long)oe) < (long)iVar3) {
              _cl_2 = (int)outsz - (int)oe;
            }
            memcpy(oe,e,(long)_cl_2);
            oe = oe + _cl_2;
          }
          rlen = iVar3 + rlen;
          if (s_00 == (char *)0x0) break;
          code[0] = '\x04';
          code[1] = '\0';
          code[2] = '\0';
          code[3] = '\0';
          e = fy_uri_esc(s_00,(long)pcVar4 - (long)s_00,(uint8_t *)&t,(int *)code);
          auVar2 = code;
          if (e == (char *)0x0) break;
          if ((oe != (char *)0x0) && (code != (uint8_t  [4])0x0)) {
            local_a0[0] = code[0];
            local_a0[1] = code[1];
            local_a0[2] = code[2];
            local_a0[3] = code[3];
            if ((long)(outsz - (long)oe) < (long)(int)code) {
              local_a0 = (uint8_t  [4])((int)outsz - (int)oe);
            }
            memcpy(oe,&t,(long)(int)local_a0);
            oe = oe + (int)local_a0;
          }
          rlen = (int)auVar2 + rlen;
        }
        fyt_local._4_4_ = rlen;
      }
    }
  }
  else {
    fyt_local._4_4_ = 0;
  }
  return fyt_local._4_4_;
}

Assistant:

static int fy_tag_token_format_internal(const struct fy_token *fyt, void *out, size_t *outszp) {
    char *o = NULL, *oe = NULL;
    size_t outsz;
    const char *handle, *suffix;
    size_t handle_size, suffix_size;
    int len, code_length, rlen;
    uint8_t code[4];
    const char *t, *s, *e;

    if (!fyt || fyt->type != FYTT_TAG)
        return 0;

    if (out && *outszp <= 0)
        return 0;

    if (out) {
        outsz = *outszp;
        o = out;
        oe = out + outsz;
    }

    if (!fyt->tag.fyt_td)
        return -1;

    handle = fy_tag_directive_token_prefix(fyt->tag.fyt_td, &handle_size);
    if (!handle)
        return -1;

    suffix = fy_atom_data(&fyt->handle) + fyt->tag.skip + fyt->tag.handle_length;
    suffix_size = fyt->tag.suffix_length;

#define O_CPY(_src, _len) \
    do { \
        int _l = (_len); \
        if (o && _l) { \
            int _cl = _l; \
            if (_cl > (oe - o)) \
                _cl = oe - o; \
            memcpy(o, (_src), _cl); \
            o += _cl; \
        } \
        len += _l; \
    } while(0)

    len = 0;
    O_CPY(handle, handle_size);

    /* escape suffix as a URI */
    s = suffix;
    e = s + suffix_size;
    while (s < e) {
        /* find next escape */
        t = memchr(s, '%', e - s);
        rlen = (t ? t : e) - s;
        O_CPY(s, rlen);

        /* end of string */
        if (!t)
            break;
        s = t;

        code_length = sizeof(code);
        t = fy_uri_esc(s, e - s, code, &code_length);
        if (!t)
            break;

        /* output escaped utf8 */
        O_CPY(code, code_length);
        s = t;
    }

#undef O_CPY
    return len;

}